

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_wear_recharge(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  borg_item_conflict *item_00;
  char *what;
  borg_item_conflict *item;
  int b_slot;
  int slot;
  int b_i;
  int i;
  
  b_slot = -1;
  item._4_4_ = L'\xffffffff';
  _Var1 = borg_check_rest(borg.c.y,borg.c.x);
  if (_Var1) {
    if (borg.trait[0x6c] == 0) {
      for (slot = 0; slot < (int)(z_info->pack_size + 0xc); slot = slot + 1) {
        item_00 = borg_items + slot;
        if ((((item_00->iqty != '\0') && (item_00->timeout != 0)) &&
            ((wVar2 = borg_wield_slot(item_00), item_00->tval != '\x18' ||
             (((uint)item_00->sval == sv_rod_recall || (borg.trait[0x69] != 0)))))) &&
           ((item_00->tval != '\x13' ||
            (((uint)item_00->sval != sv_light_torch && ((uint)item_00->sval != sv_light_lantern)))))
           ) {
          b_slot = slot;
          item._4_4_ = wVar2;
        }
      }
      if (b_slot == -1) {
        b_i._3_1_ = false;
      }
      else if ((b_slot < (int)(uint)z_info->pack_size) && (borg_items[b_slot].tval != '\x18')) {
        if (item._4_4_ < (int)(uint)z_info->pack_size) {
          b_i._3_1_ = false;
        }
        else {
          borg_note("# Swapping Item for Recharge.");
          borg_keypress(0xe000);
          borg_keypress(0x77);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[b_slot]);
          borg_keypress(0x52);
          borg_keypress(0x37);
          borg_keypress(0x35);
          borg_keypress(0x9c);
          b_i._3_1_ = true;
        }
      }
      else {
        what = format("# Waiting for \'%s\' to Recharge.",borg_items + b_slot);
        borg_note(what);
        borg_keypress(0x52);
        borg_keypress(0x37);
        borg_keypress(0x35);
        borg_keypress(0x9c);
        b_i._3_1_ = true;
      }
    }
    else {
      b_i._3_1_ = false;
    }
  }
  else {
    b_i._3_1_ = false;
  }
  return b_i._3_1_;
}

Assistant:

bool borg_wear_recharge(void)
{
    int i, b_i = -1;
    int slot   = -1;
    int b_slot = -1;

    /* No resting in danger */
    if (!borg_check_rest(borg.c.y, borg.c.x))
        return false;

    /* Not if hungry */
    if (borg.trait[BI_ISWEAK])
        return false;

    /* Look for an (wearable- non rod) item to recharge */
    for (i = 0; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip items that are charged */
        if (!item->timeout)
            continue;

        /* Where can it be worn? */
        slot = borg_wield_slot(item);
        
        /* if this is a rod, only count it if it is a rod of recall */
        /* and we are in town.  This is to prevent walking down when */
        /* the borg has a perfectly serviceable rod */
        if (item->tval == TV_ROD && item->sval != sv_rod_recall
            && borg.trait[BI_CDEPTH] == 0)
            continue;

        /* skip non-ego lights, No need to rest to recharge a torch, which uses
         * fuels turns in o_ptr->timeout */
        if (item->tval == TV_LIGHT
            && (item->sval == sv_light_torch || item->sval == sv_light_lantern))
            continue;

        /* note this one */
        b_i    = i;
        b_slot = slot;
    }

    /* nothing found */
    if (b_i == -1)
        return false;

    if (b_i >= INVEN_WIELD || borg_items[b_i].tval == TV_ROD) {
        /* Item is worn, no swap is nec. */
        borg_note(
            format("# Waiting for '%s' to Recharge.", borg_items[b_i].desc));

        /* Rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }
    /* Item must be worn to be recharged
     */
    if (b_slot >= INVEN_WIELD) {

        /* wear the item */
        borg_note("# Swapping Item for Recharge.");
        borg_keypress(ESCAPE);
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);

        /* rest for a while */
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);

        /* done */
        return true;
    }

    /* nothing to recharge */
    return false;
}